

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O2

void __thiscall
cfgfile::
tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::on_string(tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
            *this,parser_info_t<cfgfile::string_trait_t> *info,string_t *str)

{
  bool bVar1;
  exception_t<cfgfile::string_trait_t> *this_00;
  allocator local_28d;
  allocator local_28c;
  allocator local_28b;
  allocator local_28a;
  allocator local_289;
  string_t value;
  string local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  string local_208 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = tag_t<cfgfile::string_trait_t>::is_any_child_defined
                    (&this->super_tag_t<cfgfile::string_trait_t>);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&value,(string *)str);
    std::__cxx11::string::append((string *)&this->m_value);
    (this->super_tag_t<cfgfile::string_trait_t>).m_is_defined = true;
    std::__cxx11::string::~string((string *)&value);
    return;
  }
  this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string(local_148,"Value \"",&local_289);
  std::__cxx11::string::string((string *)&local_128,local_148);
  std::operator+(&local_108,&local_128,str);
  std::__cxx11::string::string(local_188,"\" for tag \"",&local_28a);
  std::__cxx11::string::string((string *)&local_168,local_188);
  std::operator+(&local_e8,&local_108,&local_168);
  std::operator+(&local_c8,&local_e8,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
  std::__cxx11::string::string
            (local_1c8,"\" must be defined before any child tag. In file \"",&local_28b);
  std::__cxx11::string::string((string *)&local_1a8,local_1c8);
  std::operator+(&local_a8,&local_c8,&local_1a8);
  std::operator+(&local_88,&local_a8,&info->m_file_name);
  std::__cxx11::string::string(local_208,"\" on line ",&local_28c);
  std::__cxx11::string::string((string *)&local_1e8,local_208);
  std::operator+(&local_68,&local_88,&local_1e8);
  std::__cxx11::to_string(&local_228,info->m_line_number);
  std::operator+(&value,&local_68,&local_228);
  std::__cxx11::string::string(local_268,".",&local_28d);
  std::__cxx11::string::string((string *)&local_248,local_268);
  std::operator+(&local_48,&value,&local_248);
  exception_t<cfgfile::string_trait_t>::exception_t(this_00,&local_48);
  __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		if( this->is_any_child_defined() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Value \"" ) + str +
				Trait::from_ascii( "\" for tag \"" ) + this->name() +
				Trait::from_ascii( "\" must be defined before any child "
					"tag. In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		const typename Trait::string_t value =
			format_t< typename Trait::string_t, Trait >::from_string( info, str );

		m_value.append( value );

		this->set_defined();
	}